

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void concatwsFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int nSep;
  char *zSep;
  
  nSep = sqlite3ValueBytes(*argv,'\x01');
  zSep = (char *)sqlite3ValueText(*argv,'\x01');
  if (zSep != (char *)0x0) {
    concatFuncCore(context,argc + -1,argv + 1,nSep,zSep);
    return;
  }
  return;
}

Assistant:

static void concatwsFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int nSep = sqlite3_value_bytes(argv[0]);
  const char *zSep = (const char*)sqlite3_value_text(argv[0]);
  if( zSep==0 ) return;
  concatFuncCore(context, argc-1, argv+1, nSep, zSep);
}